

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

Value * __thiscall Kvm::evalAssignment(Kvm *this,Value *v,Value *env)

{
  Value *pVVar1;
  Value *var;
  Value *e;
  Value *env_local;
  Value *v_local;
  Kvm *this_local;
  
  pVVar1 = assignmentValue(this,v);
  pVVar1 = eval(this,pVVar1,env);
  if (pVVar1 == (Value *)0x0) {
    this_local = (Kvm *)0x0;
  }
  else {
    var = assignmentVariable(this,v);
    setVariableValue(this,var,pVVar1,env);
    this_local = (Kvm *)this->OK;
  }
  return (Value *)this_local;
}

Assistant:

const Value* Kvm::evalAssignment(const Value *v, const Value *env)
{
    auto e = eval(assignmentValue(v), env);
    if (!e) return nullptr;
    setVariableValue(assignmentVariable(v), e, env);
    return OK;
}